

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoInline.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::NoInline::run(NoInline *this,Module *module)

{
  bool bVar1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_00;
  pointer pFVar2;
  string *__rhs;
  string local_c8;
  reference local_a8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string pattern;
  Module *module_local;
  NoInline *this_local;
  
  __rhs = &(this->super_Pass).name;
  pattern.field_2._8_8_ = module;
  std::operator+(&local_78,"Usage usage:  wasm-opt --",__rhs);
  std::operator+(&local_58,&local_78,"=WILDCARD");
  Pass::getArgument((string *)local_38,&this->super_Pass,__rhs,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = (vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             *)(pattern.field_2._8_8_ + 0x18);
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(this_00);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&func), bVar1) {
    local_a8 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end2);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_a8);
    IString::toString_abi_cxx11_(&local_c8,(IString *)pFVar2);
    bVar1 = String::wildcardMatch((string *)local_38,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((this->mode == Full) || (this->mode == Both)) {
        pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           (local_a8);
        pFVar2->noFullInline = true;
      }
      if ((this->mode == Partial) || (this->mode == Both)) {
        pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           (local_a8);
        pFVar2->noPartialInline = true;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void run(Module* module) override {
    std::string pattern =
      getArgument(name, "Usage usage:  wasm-opt --" + name + "=WILDCARD");

    for (auto& func : module->functions) {
      if (!String::wildcardMatch(pattern, func->name.toString())) {
        continue;
      }

      if (mode == Full || mode == Both) {
        func->noFullInline = true;
      }
      if (mode == Partial || mode == Both) {
        func->noPartialInline = true;
      }
    }
  }